

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

Ref<embree::SceneGraph::MaterialNode> __thiscall
embree::XMLLoader::loadBGFMaterial(XMLLoader *this,Ref<embree::XML> *xml)

{
  undefined8 in_RDX;
  MaterialNode *in_RDI;
  Parms parms;
  string name;
  string type;
  Parms *in_stack_00000618;
  string *in_stack_00000620;
  XMLLoader *in_stack_00000628;
  Ref<embree::XML> *in_stack_000008b8;
  XMLLoader *in_stack_000008c0;
  string *in_stack_ffffffffffffff10;
  XML *in_stack_ffffffffffffff18;
  allocator local_c1;
  string local_c0 [32];
  string local_a0 [55];
  allocator local_69;
  string local_68 [32];
  string local_48 [32];
  undefined8 local_28;
  undefined8 local_10;
  
  local_28 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"type",&local_69);
  XML::parm(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  local_10 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"name",&local_c1);
  XML::parm(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  loadMaterialParms(in_stack_000008c0,in_stack_000008b8);
  addMaterial(in_stack_00000628,in_stack_00000620,in_stack_00000618);
  Parms::~Parms((Parms *)0x3b9e21);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_48);
  return (Ref<embree::SceneGraph::MaterialNode>)in_RDI;
}

Assistant:

Ref<SceneGraph::MaterialNode> XMLLoader::loadBGFMaterial(const Ref<XML>& xml) 
  {
    std::string type = xml->parm("type");
    std::string name = xml->parm("name");
    Parms parms = loadMaterialParms(xml);
    return addMaterial(type,parms);
  }